

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::consumeLineBreakIfPresent(Scanner *this)

{
  iterator Position;
  iterator pcVar1;
  
  Position = this->Current;
  pcVar1 = skip_b_break(this,Position);
  if (pcVar1 != Position) {
    this->Column = 0;
    this->Line = this->Line + 1;
    this->Current = pcVar1;
  }
  return pcVar1 != Position;
}

Assistant:

bool Scanner::consumeLineBreakIfPresent() {
  auto Next = skip_b_break(Current);
  if (Next == Current)
    return false;
  Column = 0;
  ++Line;
  Current = Next;
  return true;
}